

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj,REF_INT node)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  printf(" %d :");
  uVar3 = 0xffffffff;
  uVar2 = 0xffffffff;
  if (-1 < node) {
    uVar3 = 0xffffffff;
    uVar2 = 0xffffffff;
    if (node < ref_adj->nnode) {
      uVar1 = ref_adj->first[(uint)node];
      uVar3 = 0xffffffff;
      uVar2 = 0xffffffff;
      if ((long)(int)uVar1 != -1) {
        uVar2 = (ulong)(uint)ref_adj->item[(int)uVar1].ref;
        uVar3 = (ulong)uVar1;
      }
    }
  }
  while ((int)uVar3 != -1) {
    printf(" %d",uVar2);
    uVar3 = (ulong)ref_adj->item[(int)uVar3].next;
    uVar2 = 0xffffffff;
    if (uVar3 != 0xffffffffffffffff) {
      uVar2 = (ulong)(uint)ref_adj->item[uVar3].ref;
    }
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj, REF_INT node) {
  REF_INT item, ref;
  printf(" %d :", node);
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    printf(" %d", ref);
  }
  printf("\n");

  return REF_SUCCESS;
}